

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void process_player_input_fire(tgestate_t *state,input_t input)

{
  switch(input) {
  case 10:
    pick_up_item(state);
    return;
  case 0xb:
    drop_item(state);
    return;
  case 0xc:
    use_item_common(state,state->items_held[0]);
    return;
  default:
    return;
  case 0xf:
    use_item_common(state,state->items_held[1]);
    return;
  }
}

Assistant:

void process_player_input_fire(tgestate_t *state, input_t input)
{
  assert(state != NULL);

  switch (input)
  {
  case input_UP_FIRE:
    pick_up_item(state);
    break;
  case input_DOWN_FIRE:
    drop_item(state);
    break;
  case input_LEFT_FIRE:
    use_item_common(state, state->items_held[0]); /* Conv: Inlined. */
    break;
  case input_RIGHT_FIRE:
    use_item_common(state, state->items_held[1]); /* Conv: Inlined. */
    break;
  case input_FIRE:
  default:
    break;
  }

  return;
}